

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

XmlStringRef * __thiscall
QXmlStreamReaderPrivate::namespaceForPrefix(QXmlStreamReaderPrivate *this,QStringView prefix)

{
  QStringView rhs;
  bool bVar1;
  reference pNVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_RSI;
  XmlStringRef *in_RDI;
  long in_FS_OFFSET;
  NamespaceDeclaration *namespaceDeclaration;
  R_conflict23 *__range1;
  reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*> __end1;
  reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*> __begin1;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff30;
  XmlStringRef *in_stack_ffffffffffffff38;
  char *sourceText;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar3;
  XmlStringRef *pXVar4;
  QChar in_stack_ffffffffffffff8e;
  char local_70 [48];
  undefined8 local_40;
  undefined8 local_38;
  undefined1 *local_30;
  reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*> local_28;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  int fieldWidth;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pXVar4 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  local_20 = (QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
             (anonymous_namespace)::
             reversed<QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>>
                       (in_RSI);
  local_28.current = (NamespaceDeclaration *)&DAT_aaaaaaaaaaaaaaaa;
  R::begin((R_conflict23 *)in_stack_ffffffffffffff38);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  R::end((R_conflict23 *)in_stack_ffffffffffffff38);
  do {
    bVar1 = std::operator!=((reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*> *)
                            in_stack_ffffffffffffff30,
                            (reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*> *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (!bVar1) {
      if (((ushort)*(storage_type_conflict *)&in_RSI[0x27].data >> 0xc & 1) != 0) {
        bVar1 = QStringView::isEmpty((QStringView *)0x649446);
        if (!bVar1) {
          uVar3 = 0;
          sourceText = local_70;
          QXmlStream::tr(sourceText,(char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
          fieldWidth = (int)((ulong)sourceText >> 0x20);
          QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff8e,L' ');
          QString::arg<QStringView,_true>
                    ((QString *)in_RDI,(QStringView *)CONCAT44(uVar3,in_stack_ffffffffffffff40),
                     fieldWidth,in_stack_ffffffffffffff8e);
          raiseWellFormedError
                    (in_stack_ffffffffffffff30,
                     (QString *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          QString::~QString((QString *)0x6494c7);
          QString::~QString((QString *)0x6494d1);
        }
      }
      memset(in_RDI,0,0x18);
      QtPrivate::XmlStringRef::XmlStringRef(in_RDI);
LAB_0064952d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return pXVar4;
      }
      __stack_chk_fail();
    }
    pNVar2 = std::reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*>::operator*
                       (&local_28);
    local_40 = local_18;
    local_38 = local_10;
    rhs.m_data = (storage_type_conflict *)in_RSI;
    rhs.m_size = (qsizetype)pXVar4;
    bVar1 = QtPrivate::operator==(in_stack_ffffffffffffff38,rhs);
    if (bVar1) {
      in_RDI->m_string = (pNVar2->namespaceUri).m_string;
      in_RDI->m_pos = (pNVar2->namespaceUri).m_pos;
      in_RDI->m_size = (pNVar2->namespaceUri).m_size;
      goto LAB_0064952d;
    }
    std::reverse_iterator<QXmlStreamPrivateTagStack::NamespaceDeclaration_*>::operator++(&local_28);
  } while( true );
}

Assistant:

XmlStringRef QXmlStreamReaderPrivate::namespaceForPrefix(QStringView prefix)
{
     for (const NamespaceDeclaration &namespaceDeclaration : reversed(namespaceDeclarations)) {
         if (namespaceDeclaration.prefix == prefix) {
             return namespaceDeclaration.namespaceUri;
         }
     }

#if 1
     if (namespaceProcessing && !prefix.isEmpty())
         raiseWellFormedError(QXmlStream::tr("Namespace prefix '%1' not declared").arg(prefix));
#endif

     return XmlStringRef();
}